

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O2

void __thiscall
slang::analysis::DataFlowAnalysis::DataFlowAnalysis
          (DataFlowAnalysis *this,AnalysisContext *context,Symbol *symbol,bool reportDiags)

{
  undefined7 in_register_00000009;
  Diagnostics *pDVar1;
  
  pDVar1 = (Diagnostics *)0x0;
  if ((int)CONCAT71(in_register_00000009,reportDiags) != 0) {
    pDVar1 = &context->diagnostics;
  }
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::
  FlowAnalysisBase(&this->
                    super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                   ,symbol,((context->manager).ptr)->options,pDVar1);
  this->context = context;
  (this->bitMapAllocator).alloc = &context->alloc;
  (this->bitMapAllocator).freeList = (FreeNode *)0x0;
  (this->lspMapAllocator).alloc = &context->alloc;
  (this->lspMapAllocator).freeList = (FreeNode *)0x0;
  SmallMap<const_slang::ast::ValueSymbol_*,_unsigned_int,_4UL,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
  ::SmallMap(&this->symbolToSlot);
  (this->lvalues).super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.data_ =
       (pointer)(this->lvalues).
                super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.firstElement;
  (this->lvalues).super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.len = 0;
  (this->lvalues).super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.cap = 2;
  SmallMap<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_4UL,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
  ::SmallMap(&this->rvalues);
  (this->lspVisitor).owner = this;
  (this->lspVisitor).currentLSP = (Expression *)0x0;
  this->isLValue = false;
  (this->timedStatements).super_SmallVectorBase<const_slang::ast::Statement_*>.data_ =
       (pointer)(this->timedStatements).super_SmallVectorBase<const_slang::ast::Statement_*>.
                firstElement;
  (this->timedStatements).super_SmallVectorBase<const_slang::ast::Statement_*>.len = 0;
  (this->timedStatements).super_SmallVectorBase<const_slang::ast::Statement_*>.cap = 5;
  (this->concurrentAssertions).
  super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
  .data_ = (pointer)(this->concurrentAssertions).
                    super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
                    .firstElement;
  (this->concurrentAssertions).
  super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
  .len = 0;
  (this->concurrentAssertions).
  super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
  .cap = 2;
  (this->sampledValueCalls).super_SmallVectorBase<const_slang::ast::CallExpression_*>.data_ =
       (pointer)(this->sampledValueCalls).super_SmallVectorBase<const_slang::ast::CallExpression_*>.
                firstElement;
  (this->sampledValueCalls).super_SmallVectorBase<const_slang::ast::CallExpression_*>.len = 0;
  (this->sampledValueCalls).super_SmallVectorBase<const_slang::ast::CallExpression_*>.cap = 5;
  return;
}

Assistant:

DataFlowAnalysis::DataFlowAnalysis(AnalysisContext& context, const Symbol& symbol,
                                   bool reportDiags) :
    AbstractFlowAnalysis(symbol, context.manager->getOptions(),
                         reportDiags ? &context.diagnostics : nullptr),
    context(context), bitMapAllocator(context.alloc), lspMapAllocator(context.alloc),
    lspVisitor(*this) {
}